

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Cues::~Cues(Cues *this)

{
  CuePoint *this_00;
  long in_RDI;
  CuePoint *cue;
  int32_t i;
  undefined4 local_c;
  
  if (*(long *)(in_RDI + 8) != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 4); local_c = local_c + 1) {
      this_00 = *(CuePoint **)(*(long *)(in_RDI + 8) + (long)local_c * 8);
      if (this_00 != (CuePoint *)0x0) {
        CuePoint::~CuePoint(this_00);
        operator_delete(this_00);
      }
    }
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
  }
  return;
}

Assistant:

Cues::~Cues() {
  if (cue_entries_) {
    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      CuePoint* const cue = cue_entries_[i];
      delete cue;
    }
    delete[] cue_entries_;
  }
}